

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_vec3 rf_quaternion_to_euler(rf_quaternion q)

{
  rf_vec3 rVar1;
  float fVar2;
  float fVar3;
  float local_50;
  float local_4c;
  float z1;
  float z0;
  float y0;
  float x1;
  float x0;
  rf_quaternion q_local;
  rf_vec3 result;
  
  q_local._0_8_ = q._8_8_;
  memset(&q_local.z,0,0xc);
  x1 = q.x;
  x0 = q.y;
  fVar2 = x1 * x1 + x0 * x0;
  fVar2 = atan2f((q_local.y * x1 + x0 * q_local.x) * 2.0,1.0 - (fVar2 + fVar2));
  q_local.z = fVar2 * 57.295776;
  local_4c = (q_local.y * x0 + -(q_local.x * x1)) * 2.0;
  if (1.0 < local_4c) {
    local_4c = 1.0;
  }
  if (-1.0 <= local_4c) {
    local_50 = local_4c;
  }
  else {
    local_50 = -1.0;
  }
  fVar2 = asinf(local_50);
  q_local.w = fVar2 * 57.295776;
  fVar2 = q_local.y * q_local.x + x1 * x0;
  fVar3 = x0 * x0 + q_local.x * q_local.x;
  fVar2 = atan2f(fVar2 + fVar2,1.0 - (fVar3 + fVar3));
  rVar1.y = q_local.w;
  rVar1.x = q_local.z;
  rVar1.z = fVar2 * 57.295776;
  return rVar1;
}

Assistant:

RF_API rf_vec3 rf_quaternion_to_euler(rf_quaternion q)
{
    rf_vec3 result = {0};

// roll (x-axis rotation)
    float x0 = 2.0f * (q.w * q.x + q.y * q.z);
    float x1 = 1.0f - 2.0f * (q.x * q.x + q.y * q.y);
    result.x = atan2f(x0, x1) * RF_RAD2DEG;

// pitch (y-axis rotation)
    float y0 = 2.0f * (q.w * q.y - q.z * q.x);
    y0 = y0 > 1.0f ? 1.0f : y0;
    y0 = y0 < -1.0f ? -1.0f : y0;
    result.y = asinf(y0) * RF_RAD2DEG;

// yaw (z-axis rotation)
    float z0 = 2.0f * (q.w * q.z + q.x * q.y);
    float z1 = 1.0f - 2.0f * (q.y * q.y + q.z * q.z);
    result.z = atan2f(z0, z1) * RF_RAD2DEG;

    return result;
}